

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogger.cpp
# Opt level: O3

void __thiscall clog::AsyncLogger::start(AsyncLogger *this)

{
  long *local_20;
  thread local_18;
  
  this->running_ = true;
  local_18._M_id._M_thread = (id)0;
  local_20 = (long *)operator_new(0x10);
  *local_20 = (long)&PTR___State_0010ad38;
  local_20[1] = (long)this;
  std::thread::_M_start_thread(&local_18,&local_20,0);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  if ((this->thread_)._M_id._M_thread == 0) {
    (this->thread_)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void AsyncLogger::start()
{
    running_ = true;
    thread_ = std::thread([this](){  this->threadFunc(); });
}